

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

MPP_RET fps_calc_init(FpsCalc *ctx)

{
  MPP_RET MVar1;
  FpsCalc pvVar2;
  
  pvVar2 = (FpsCalc)mpp_osal_calloc("fps_calc_init",0x40);
  if (pvVar2 == (FpsCalc)0x0) {
    MVar1 = MPP_NOK;
  }
  else {
    mpp_spinlock_init(pvVar2);
    MVar1 = MPP_OK;
  }
  *ctx = pvVar2;
  return MVar1;
}

Assistant:

MPP_RET fps_calc_init(FpsCalc *ctx)
{
    FpsCalcImpl *impl = mpp_calloc(FpsCalcImpl, 1);
    MPP_RET ret = MPP_NOK;

    if (impl) {
        mpp_spinlock_init(&impl->lock);
        ret = MPP_OK;
    }
    *ctx = impl;

    return ret;
}